

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

void __thiscall Map::calcBall(Map *this,int n)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  Palette *pPVar6;
  double dVar7;
  double dVar8;
  Ball *pBVar9;
  long lVar10;
  uint y;
  uint x;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  if (0x1d < (uint)n) goto LAB_0010456a;
  if (this->ball[(uint)n] == (Ball *)0x0) goto LAB_0010456a;
  dVar7 = cos((double)this->ball[(uint)n]->angle * 3.14);
  fVar15 = this->ball[(uint)n]->speed;
  dVar8 = sin((double)this->ball[(uint)n]->angle * 3.14);
  pBVar9 = this->ball[(uint)n];
  fVar13 = (float)(dVar7 * (double)fVar15);
  fVar14 = (float)(dVar8 * (double)pBVar9->speed);
  uVar1 = pBVar9->x;
  uVar2 = pBVar9->y;
  fVar15 = (float)uVar1 + fVar13;
  fVar16 = (float)uVar2 + fVar14;
  pBVar9->x = fVar15;
  pBVar9->y = fVar16;
  if ((fVar15 <= 0.0) || ((float)this->fieldWidth <= fVar15)) {
    fVar11 = pBVar9->angle;
    if (fVar11 <= 0.0) {
      if (fVar11 < 0.0) {
        fVar12 = -1.0;
        goto LAB_00104286;
      }
      fVar12 = -fVar11;
    }
    else {
      fVar12 = 1.0;
LAB_00104286:
      fVar12 = fVar12 - fVar11;
    }
    pBVar9->angle = fVar12;
    fVar15 = fVar15 - fVar13;
    pBVar9->x = fVar15;
LAB_001042a4:
    pBVar9->speed = (float)((double)pBVar9->speed + 0.01);
  }
  else if (fVar16 <= 0.0) {
    pBVar9->angle = -pBVar9->angle;
    fVar16 = fVar16 - fVar14;
    pBVar9->y = fVar16;
    goto LAB_001042a4;
  }
  iVar4 = this->fieldBreakpoint;
  if (((float)iVar4 <= fVar16) && (pPVar6 = this->palette, fVar16 <= (float)(pPVar6->h + iVar4))) {
    fVar11 = (float)pPVar6->pos;
    if ((fVar11 <= fVar15) && (iVar5 = pPVar6->w, fVar15 <= (float)(pPVar6->pos + iVar5))) {
      if (this->stickyPalette == true) {
        lVar10 = 0;
        do {
          if (pPVar6->dockedBalls[lVar10] == (Ball *)0x0) {
            pBVar9->angle = ((fVar15 - fVar11) / (float)iVar5) * 0.7 + -0.9;
            pBVar9->y = 392.0;
            pBVar9->speed = 0.0;
            pPVar6->dockedBalls[lVar10] = pBVar9;
            pBVar9 = this->ball[(uint)n];
            fVar15 = pBVar9->x;
            fVar16 = pBVar9->y;
            break;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x1e);
      }
      else {
        fVar16 = (float)(iVar4 + -8);
        pBVar9->y = fVar16;
        pBVar9->angle = ((fVar15 - fVar11) / (float)iVar5) * 0.7 + -0.9;
      }
    }
  }
  x = (uint)(fVar15 / 24.0);
  if ((x < 0x18) && (y = (uint)(fVar16 * 0.0625), y < 0x10)) {
    cVar3 = this->block[x][y]->type;
    if (cVar3 != '\x18') {
      if (cVar3 == 'O') goto LAB_00104550;
      deleteBlock(this,x,y);
      pBVar9 = this->ball[(uint)n];
    }
    if (x == (int)((fVar15 - fVar13) / 24.0)) {
      pBVar9->angle = -pBVar9->angle;
      pBVar9->x = pBVar9->x - fVar13;
      if (pBVar9->speed < 1.2) {
        pBVar9->speed = pBVar9->speed + 0.01;
      }
    }
    if (y == (int)((fVar16 - fVar14) * 0.0625)) {
      fVar15 = pBVar9->angle;
      if (fVar15 <= 0.0) {
        if (fVar15 < 0.0) {
          fVar16 = -1.0;
          goto LAB_00104506;
        }
        fVar16 = -fVar15;
      }
      else {
        fVar16 = 1.0;
LAB_00104506:
        fVar16 = fVar16 - fVar15;
      }
      pBVar9->angle = fVar16;
      fVar16 = pBVar9->y - fVar14;
      pBVar9->y = fVar16;
      if (pBVar9->speed < 1.2) {
        pBVar9->speed = pBVar9->speed + 0.01;
      }
    }
    else {
      fVar16 = pBVar9->y;
    }
  }
LAB_00104550:
  if ((float)this->fieldHeight < fVar16) {
    removeBall(this,n);
  }
LAB_0010456a:
  if (this->balls < 1) {
    this->lose = true;
    this->lives = this->lives + -1;
  }
  else if (this->blockAmount < 1) {
    this->lose = true;
  }
  return;
}

Assistant:

void Map::calcBall(int n){
    if(n>=0 && n<MAX_BALLS && ball[n]){
        float dx = cos(ball[n]->angle*PI)*ball[n]->speed;
        float dy = sin(ball[n]->angle*PI)*ball[n]->speed;
        ball[n]->x += dx;
        ball[n]->y += dy;
        // Border collision
            if(ball[n]->x<=0 || ball[n]->x>=fieldWidth){
                ball[n]->angle = shiftAngleV(ball[n]->angle);
                ball[n]->x -= dx;
                if(ACCELERATE_ON_BOUNCE)
                    ball[n]->speed += ACCELERATE_ON_BOUNCE;
            } else if(ball[n]->y<=0){
                ball[n]->angle = shiftAngleH(ball[n]->angle);
                ball[n]->y -= dy;
                if(ACCELERATE_ON_BOUNCE)
                    ball[n]->speed += ACCELERATE_ON_BOUNCE;
            }
        // Palette collision
            if(ball[n]->y >= fieldBreakpoint && ball[n]->y <= fieldBreakpoint + palette->h
                    && ball[n]->x >= palette->pos && ball[n]->x <= palette->pos + palette->w){
                if(stickyPalette){
                    for(int i=0; i<MAX_BALLS; i++){
                        if(!palette->dockedBalls[i]){
                            float palx = ball[n]->x - palette->pos;
                            ball[n]->angle = -0.9 + (palx / palette->w) * 0.7;
                            ball[n]->y = PALETTE_ROW*BLOCK_H - BALL_H;
                            ball[n]->speed = 0;
                            palette->dockedBalls[i] = ball[n];
                            break;
                        }
                    }

                } else{
                    ball[n]->y = fieldBreakpoint - BALL_H;
                    float palx = ball[n]->x - palette->pos;
                    ball[n]->angle = -0.9 + (palx / palette->w) * 0.7;
                }
            }
        // Nearby block collision
            int bx = ball[n]->x / BLOCK_W;
            int by = ball[n]->y / BLOCK_H;
            int px = (ball[n]->x-dx) / BLOCK_W;
            int py = (ball[n]->y-dy) / BLOCK_H;
            if(bx >= 0 && bx < BLOCKS_W && by >= 0 && by < BLOCKS_H) {
                if(block[bx][by]->type != EMPTY_BLOCK_ID){
                    if(block[bx][by]->type != BLOCK_BLOCKY_ID) deleteBlock(bx, by);
                    if(bx == px){
                        ball[n]->angle = shiftAngleH(ball[n]->angle);
                        ball[n]->x -= dx;
                        if(ACCELERATE_ON_BOUNCE && ball[n]->speed < BALL_MAX_SPEED)
                            ball[n]->speed += ACCELERATE_ON_BOUNCE;
                    }
                    if(by == py){
                        ball[n]->angle = shiftAngleV(ball[n]->angle);
                        ball[n]->y -= dy;
                        if(ACCELERATE_ON_BOUNCE && ball[n]->speed < BALL_MAX_SPEED)
                            ball[n]->speed += ACCELERATE_ON_BOUNCE;
                    }

                }

            }

        // Fly through breakpoint
            if(ball[n]->y > fieldHeight){
                //ball[n]->angle = shiftAngleH(ball[n]->angle);
                removeBall(n);
            }
    }
    if(balls<=0) {
        lose = true;
        lives--;
    } else if(blockAmount <= 0){
        lose = true;
    }
}